

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O3

void __thiscall MT32Emu::Poly::partialDeactivated(Poly *this,Partial *partial)

{
  PolyState PVar1;
  uint uVar2;
  Synth *pSVar3;
  long lVar4;
  
  uVar2 = this->activePartialCount;
  lVar4 = 4;
  do {
    if (this->partials[lVar4 + -4] == partial) {
      this->partials[lVar4 + -4] = (Partial *)0x0;
      uVar2 = uVar2 - 1;
      this->activePartialCount = uVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if (uVar2 == 0) {
    PVar1 = this->state;
    if (PVar1 != POLY_Inactive) {
      this->state = POLY_Inactive;
      (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,3);
    }
    pSVar3 = Part::getSynth(this->part);
    if (pSVar3->abortingPoly == this) {
      pSVar3 = Part::getSynth(this->part);
      pSVar3->abortingPoly = (Poly *)0x0;
    }
  }
  Part::partialDeactivated(this->part,this);
  return;
}

Assistant:

void Poly::partialDeactivated(Partial *partial) {
	for (int i = 0; i < 4; i++) {
		if (partials[i] == partial) {
			partials[i] = NULL;
			activePartialCount--;
		}
	}
	if (activePartialCount == 0) {
		setState(POLY_Inactive);
		if (part->getSynth()->abortingPoly == this) {
			part->getSynth()->abortingPoly = NULL;
		}
	}
	part->partialDeactivated(this);
}